

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  stbi_uc *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  byte bVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  byte *pbVar13;
  long lVar14;
  stbi_uc *psVar15;
  int iVar16;
  stbi_uc sVar17;
  ulong uVar18;
  long lVar19;
  stbi__uint32 sVar20;
  stbi__uint32 sVar21;
  uint uVar22;
  ulong uVar23;
  long in_FS_OFFSET;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_00157112:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_distance;
    iVar12 = 0;
    do {
      pcVar6 = "zlib corrupt";
      if (iVar12 < 1) {
        stbi__fill_bits(a);
        iVar12 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar20 = uVar1 >> 1;
      a->code_buffer = sVar20;
      iVar4 = iVar12 + -1;
      a->num_bits = iVar4;
      if (iVar12 < 3) {
        stbi__fill_bits(a);
        iVar4 = a->num_bits;
        sVar20 = a->code_buffer;
      }
      sVar21 = sVar20 >> 2;
      a->code_buffer = sVar21;
      uVar3 = iVar4 - 2;
      a->num_bits = uVar3;
      switch(sVar20 & 3) {
      case 0:
        uVar10 = uVar3 & 7;
        if (uVar10 != 0) {
          if (iVar4 < 2) {
            stbi__fill_bits(a);
            uVar3 = a->num_bits;
            sVar21 = a->code_buffer;
          }
          sVar21 = sVar21 >> (sbyte)uVar10;
          a->code_buffer = sVar21;
          uVar3 = uVar3 - uVar10;
          a->num_bits = uVar3;
        }
        if ((int)uVar3 < 1) {
          if (uVar3 != 0) goto LAB_00157a16;
          uVar23 = 0;
LAB_001578ec:
          psVar15 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          do {
            if (psVar15 < psVar2) {
              a->zbuffer = psVar15 + 1;
              sVar17 = *psVar15;
              psVar15 = psVar15 + 1;
            }
            else {
              sVar17 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar23) = sVar17;
            uVar23 = uVar23 + 1;
          } while (uVar23 != 4);
        }
        else {
          uVar10 = uVar3 - 1 >> 3;
          uVar23 = (ulong)(uVar10 + 1);
          uVar18 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar18 + 1) = (char)sVar21;
            sVar21 = sVar21 >> 8;
            uVar18 = uVar18 + 1;
          } while (uVar10 != uVar18);
          a->code_buffer = sVar21;
          iVar12 = (uVar3 - 8) - (uVar3 - 1 & 0xfffffff8);
          a->num_bits = iVar12;
          if (iVar12 != 0) {
LAB_00157a16:
            __assert_fail("a->num_bits == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                          ,0x1095,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
          }
          if (uVar18 < 3) goto LAB_001578ec;
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) {
LAB_001579ec:
          *(char **)(in_FS_OFFSET + -0x10) = pcVar6;
          return 0;
        }
        psVar15 = a->zbuffer;
        uVar23 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar15 + uVar23) {
          pcVar6 = "read past buffer";
          goto LAB_001579ec;
        }
        pcVar6 = a->zout;
        if (a->zout_end < pcVar6 + uVar23) {
          iVar12 = stbi__zexpand(a,pcVar6,(uint)local_814.fast[0]);
          if (iVar12 == 0) {
            return 0;
          }
          psVar15 = a->zbuffer;
          pcVar6 = a->zout;
        }
        memcpy(pcVar6,psVar15,uVar23);
        a->zbuffer = a->zbuffer + uVar23;
        a->zout = a->zout + uVar23;
        goto LAB_00157987;
      case 1:
        iVar12 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar12 == 0) {
          return 0;
        }
        iVar12 = stbi__zbuild_huffman
                           (z,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar4 < 7) {
          stbi__fill_bits(a);
          uVar3 = a->num_bits;
          sVar21 = a->code_buffer;
        }
        sVar20 = sVar21 >> 5;
        a->code_buffer = sVar20;
        iVar12 = uVar3 - 5;
        a->num_bits = iVar12;
        if ((int)uVar3 < 10) {
          stbi__fill_bits(a);
          iVar12 = a->num_bits;
          sVar20 = a->code_buffer;
        }
        uVar3 = sVar20 >> 5;
        a->code_buffer = uVar3;
        iVar4 = iVar12 + -5;
        a->num_bits = iVar4;
        if (iVar12 < 9) {
          stbi__fill_bits(a);
          iVar4 = a->num_bits;
          uVar3 = a->code_buffer;
        }
        uVar22 = (sVar21 & 0x1f) + 0x101;
        iVar12 = (sVar20 & 0x1f) + 1;
        uVar10 = uVar3 >> 4;
        a->code_buffer = uVar10;
        iVar4 = iVar4 + -4;
        a->num_bits = iVar4;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        uVar23 = 0;
        do {
          uVar11 = uVar10;
          if (iVar4 < 3) {
            stbi__fill_bits(a);
            iVar4 = a->num_bits;
            uVar11 = a->code_buffer;
          }
          uVar10 = uVar11 >> 3;
          a->code_buffer = uVar10;
          iVar4 = iVar4 + -3;
          a->num_bits = iVar4;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar23]
                   ) = (byte)uVar11 & 7;
          uVar23 = uVar23 + 1;
        } while ((uVar3 & 0xf) + 4 != uVar23);
        iVar4 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar4 == 0) {
          return 0;
        }
        iVar5 = iVar12 + uVar22;
        iVar4 = a->num_bits;
        iVar16 = 0;
        do {
          if (iVar4 < 0x10) {
            stbi__fill_bits(a);
          }
          uVar3 = a->code_buffer;
          uVar9 = local_814.fast[uVar3 & 0x1ff];
          if (uVar9 == 0) {
            uVar9 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
            uVar10 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
            uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
            uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
            lVar7 = 0;
            do {
              lVar14 = lVar7;
              lVar7 = lVar14 + 1;
            } while (local_814.maxcode[lVar14 + 10] <= (int)uVar10);
            if (lVar7 == 7) goto LAB_00157996;
            lVar19 = (ulong)local_814.firstsymbol[lVar14 + 10] +
                     ((ulong)(uVar10 >> (7U - (char)lVar7 & 0x1f)) -
                     (ulong)local_814.firstcode[lVar14 + 10]);
            if ((ulong)*(byte *)((long)&local_814 + lVar19 + 0x484) - 9 != lVar7) goto LAB_001579f7;
            uVar3 = uVar3 >> ((char)lVar14 + 10U & 0x1f);
            a->code_buffer = uVar3;
            iVar4 = (a->num_bits - (int)lVar7) + -9;
            a->num_bits = iVar4;
            uVar9 = *(ushort *)((long)&local_814 + lVar19 * 2 + 0x5a4);
          }
          else {
            uVar3 = uVar3 >> ((byte)(uVar9 >> 9) & 0x1f);
            a->code_buffer = uVar3;
            iVar4 = a->num_bits - (uint)(uVar9 >> 9);
            a->num_bits = iVar4;
            uVar9 = uVar9 & 0x1ff;
          }
          if (0x12 < uVar9) goto LAB_00157996;
          if (uVar9 < 0x10) {
            lVar7 = (long)iVar16;
            iVar16 = iVar16 + 1;
            local_9e8[lVar7] = (char)uVar9;
          }
          else {
            if (uVar9 == 0x11) {
              if (iVar4 < 3) {
                stbi__fill_bits(a);
                iVar4 = a->num_bits;
                uVar3 = a->code_buffer;
              }
              a->code_buffer = uVar3 >> 3;
              iVar4 = iVar4 + -3;
              a->num_bits = iVar4;
              uVar3 = (uVar3 & 7) + 3;
LAB_00157515:
              bVar8 = 0;
            }
            else {
              if (uVar9 != 0x10) {
                if (iVar4 < 7) {
                  stbi__fill_bits(a);
                  iVar4 = a->num_bits;
                  uVar3 = a->code_buffer;
                }
                a->code_buffer = uVar3 >> 7;
                iVar4 = iVar4 + -7;
                a->num_bits = iVar4;
                uVar3 = (uVar3 & 0x7f) + 0xb;
                goto LAB_00157515;
              }
              if (iVar4 < 2) {
                stbi__fill_bits(a);
                iVar4 = a->num_bits;
                uVar3 = a->code_buffer;
              }
              a->code_buffer = uVar3 >> 2;
              iVar4 = iVar4 + -2;
              a->num_bits = iVar4;
              if (iVar16 == 0) goto LAB_00157996;
              uVar3 = (uVar3 & 3) + 3;
              bVar8 = (&bStack_9e9)[iVar16];
            }
            if (iVar5 - iVar16 < (int)uVar3) goto LAB_00157996;
            memset(local_9e8 + iVar16,(uint)bVar8,(ulong)uVar3);
            iVar16 = iVar16 + uVar3;
          }
        } while (iVar16 < iVar5);
        if (iVar16 != iVar5) {
LAB_00157996:
          pcVar6 = "bad codelengths";
          goto LAB_001579c1;
        }
        iVar4 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar22);
        if (iVar4 == 0) {
          return 0;
        }
        iVar12 = stbi__zbuild_huffman(z,local_9e8 + uVar22,iVar12);
        break;
      case 3:
        goto LAB_001579cc;
      }
      if (iVar12 == 0) {
        return 0;
      }
      pcVar6 = a->zout;
LAB_0015759a:
      if (a->num_bits < 0x10) {
        stbi__fill_bits(a);
      }
      uVar3 = a->code_buffer;
      uVar9 = (a->z_length).fast[uVar3 & 0x1ff];
      if (uVar9 == 0) {
        uVar9 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
        uVar10 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
        uVar10 = (uVar10 >> 2 & 0x3333) + (uVar10 & 0x3333) * 4;
        uVar10 = (uVar10 >> 1 & 0x5555) + (uVar10 & 0x5555) * 2;
        lVar7 = 0;
        do {
          lVar14 = lVar7;
          lVar7 = lVar14 + 1;
        } while ((a->z_length).maxcode[lVar14 + 10] <= (int)uVar10);
        if (lVar7 != 7) {
          lVar19 = (ulong)(a->z_length).firstsymbol[lVar14 + 10] +
                   ((ulong)(uVar10 >> (7U - (char)lVar7 & 0x1f)) -
                   (ulong)(a->z_length).firstcode[lVar14 + 10]);
          if ((ulong)*(byte *)((long)a + lVar19 + 0x4b8) - 9 == lVar7) {
            uVar3 = uVar3 >> ((char)lVar14 + 10U & 0x1f);
            a->code_buffer = uVar3;
            iVar12 = (a->num_bits - (int)lVar7) + -9;
            a->num_bits = iVar12;
            uVar10 = (uint)*(ushort *)((long)a + lVar19 * 2 + 0x5d8);
            goto LAB_00157681;
          }
          goto LAB_001579f7;
        }
LAB_001579a8:
        pcVar6 = "bad huffman code";
        goto LAB_001579c1;
      }
      uVar3 = uVar3 >> ((byte)(uVar9 >> 9) & 0x1f);
      a->code_buffer = uVar3;
      iVar12 = a->num_bits - (uint)(uVar9 >> 9);
      a->num_bits = iVar12;
      uVar10 = uVar9 & 0x1ff;
LAB_00157681:
      if (uVar10 < 0x100) {
        if (a->zout_end <= pcVar6) {
          iVar12 = stbi__zexpand(a,pcVar6,1);
          if (iVar12 == 0) {
            return 0;
          }
          pcVar6 = a->zout;
        }
        *pcVar6 = (char)uVar10;
        pcVar6 = pcVar6 + 1;
        goto LAB_0015759a;
      }
      if (uVar10 != 0x100) {
        uVar23 = (ulong)(uVar10 - 0x101);
        uVar10 = stbi__zlength_base[uVar23];
        if (0xffffffffffffffeb < uVar23 - 0x1c) {
          iVar4 = stbi__zlength_extra[uVar23];
          if (iVar12 < iVar4) {
            stbi__fill_bits(a);
            iVar12 = a->num_bits;
            uVar3 = a->code_buffer;
          }
          uVar22 = ~(-1 << ((byte)iVar4 & 0x1f)) & uVar3;
          uVar3 = uVar3 >> ((byte)iVar4 & 0x1f);
          a->code_buffer = uVar3;
          iVar12 = iVar12 - iVar4;
          a->num_bits = iVar12;
          uVar10 = uVar10 + uVar22;
        }
        if (iVar12 < 0x10) {
          stbi__fill_bits(a);
          uVar3 = a->code_buffer;
        }
        uVar9 = z->fast[uVar3 & 0x1ff];
        if (uVar9 == 0) {
          uVar9 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
          uVar22 = (uVar9 & 0xf0f) << 4 | (uVar9 & 0xf0f0) >> 4;
          uVar22 = (uVar22 >> 2 & 0x3333) + (uVar22 & 0x3333) * 4;
          uVar22 = (uVar22 >> 1 & 0x5555) + (uVar22 & 0x5555) * 2;
          lVar7 = 0;
          do {
            lVar14 = lVar7;
            lVar7 = lVar14 + 1;
          } while ((a->z_distance).maxcode[lVar14 + 10] <= (int)uVar22);
          if (lVar7 == 7) goto LAB_001579a8;
          lVar19 = (ulong)(a->z_distance).firstsymbol[lVar14 + 10] +
                   ((ulong)(uVar22 >> (7U - (char)lVar7 & 0x1f)) -
                   (ulong)(a->z_distance).firstcode[lVar14 + 10]);
          if ((ulong)*(byte *)((long)a + lVar19 + 0xc9c) - 9 != lVar7) {
LAB_001579f7:
            __assert_fail("z->size[b] == s",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Tigermouthbear[P]flappytiger/src/render/buffer/../stb_image.h"
                          ,0xff8,
                          "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
          }
          uVar3 = uVar3 >> ((char)lVar14 + 10U & 0x1f);
          a->code_buffer = uVar3;
          iVar12 = (a->num_bits - (int)lVar7) + -9;
          a->num_bits = iVar12;
          uVar22 = (uint)*(ushort *)((long)a + lVar19 * 2 + 0xdbc);
        }
        else {
          uVar3 = uVar3 >> ((byte)(uVar9 >> 9) & 0x1f);
          a->code_buffer = uVar3;
          iVar12 = a->num_bits - (uint)(uVar9 >> 9);
          a->num_bits = iVar12;
          uVar22 = uVar9 & 0x1ff;
        }
        uVar23 = (ulong)uVar22;
        iVar4 = stbi__zdist_base[uVar23];
        if (0xffffffffffffffe5 < uVar23 - 0x1e) {
          iVar5 = stbi__zdist_extra[uVar23];
          if (iVar12 < iVar5) {
            stbi__fill_bits(a);
            iVar12 = a->num_bits;
            uVar3 = a->code_buffer;
          }
          a->code_buffer = uVar3 >> ((byte)iVar5 & 0x1f);
          a->num_bits = iVar12 - iVar5;
          iVar4 = iVar4 + (~(-1 << ((byte)iVar5 & 0x1f)) & uVar3);
        }
        if ((long)pcVar6 - (long)a->zout_start < (long)iVar4) {
          pcVar6 = "bad dist";
          goto LAB_001579c1;
        }
        if (a->zout_end < pcVar6 + (int)uVar10) {
          iVar12 = stbi__zexpand(a,pcVar6,uVar10);
          if (iVar12 == 0) {
            return 0;
          }
          pcVar6 = a->zout;
        }
        lVar7 = -(long)iVar4;
        if (iVar4 == 1) {
          if (uVar10 != 0) {
            memset(pcVar6,(uint)(byte)pcVar6[lVar7],(ulong)uVar10);
            pcVar6 = pcVar6 + (ulong)(uVar10 - 1) + 1;
          }
        }
        else {
          for (; uVar10 != 0; uVar10 = uVar10 - 1) {
            *pcVar6 = pcVar6[lVar7];
            pcVar6 = pcVar6 + 1;
          }
        }
        goto LAB_0015759a;
      }
      a->zout = pcVar6;
LAB_00157987:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar12 = a->num_bits;
    } while( true );
  }
  pbVar13 = a->zbuffer;
  uVar9 = 0;
  if (pbVar13 < a->zbuffer_end) {
    a->zbuffer = pbVar13 + 1;
    bVar8 = *pbVar13;
    pbVar13 = pbVar13 + 1;
  }
  else {
    bVar8 = 0;
  }
  if (pbVar13 < a->zbuffer_end) {
    a->zbuffer = pbVar13 + 1;
    uVar9 = (ushort)*pbVar13;
  }
  if ((ushort)(((ushort)bVar8 << 8 | uVar9) * 0x7bdf) < 0x843) {
    if ((uVar9 & 0x20) == 0) {
      if ((bVar8 & 0xf) == 8) goto LAB_00157112;
      pcVar6 = "bad compression";
    }
    else {
      pcVar6 = "no preset dict";
    }
  }
  else {
    pcVar6 = "bad zlib header";
  }
LAB_001579c1:
  *(char **)(in_FS_OFFSET + -0x10) = pcVar6;
LAB_001579cc:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}